

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O2

cell_index_t itree_add_child(itree_t *t,cell_index_t parent,cell_id_t id)

{
  cell_t *pcVar1;
  cell_index_t cVar2;
  undefined8 in_RAX;
  cell_index_t end;
  cell_index_t local_24;
  
  local_24 = (cell_index_t)((ulong)in_RAX >> 0x20);
  pcVar1 = t->cell;
  if (pcVar1[parent].child == 0xffffffff) {
    cVar2 = itree_new_cell(t);
    pcVar1[parent].child = cVar2;
    pcVar1[cVar2].id = id;
    pcVar1[cVar2].child = 0xffffffff;
    pcVar1[cVar2].sib = 0xffffffff;
  }
  else {
    cVar2 = itree_find(t,&local_24,pcVar1[parent].child,id);
    if (cVar2 == 0xffffffff) {
      cVar2 = itree_add_sib(t,local_24,id);
      return cVar2;
    }
  }
  return cVar2;
}

Assistant:

cell_index_t itree_add_child(itree_t *t,
			     cell_index_t parent,
			     cell_id_t id)
{
    cell_index_t end;
    cell_index_t child;
    cell_index_t new;
    cell_t *cell;

    cell = t->cell;

    if (cell[parent].child == NO_ID) {
	new = itree_new_cell(t);

	cell[parent].child = new;

	cell[new].id = id;
	cell[new].sib = NULL_INDEX;
	cell[new].child = NULL_INDEX;

	child = new;
    }
    else {
	child = itree_find(t, &end, cell[parent].child, id);
	if (child == NULL_INDEX) {
	    child = itree_add_sib(t, end, id);
	}
    }

    return child;
}